

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processDisconnectCommand(CommonCore *this,ActionMessage *cmd)

{
  initializer_list_t init;
  string_view jsonString;
  string_view jsonString_00;
  string_view jsonString_01;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view queryStr;
  FederateStates FVar1;
  OperatingState OVar2;
  bool bVar3;
  BrokerState BVar4;
  action_t aVar5;
  pointer pBVar6;
  reference pvVar7;
  FedInfo *pFVar8;
  FedInfo *pFVar9;
  FederateState *pFVar10;
  ActionMessage *in_RSI;
  CommonCore *in_RDI;
  FedInfo fed_2;
  const_iterator __end3;
  const_iterator __begin3;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range3;
  ActionMessage bye;
  BrokerState cstate;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> fed_1;
  string debugString;
  json element_2;
  string str_1;
  json element_1;
  string str;
  json element;
  string ret;
  FedInfo *fed;
  const_iterator __end4;
  const_iterator __begin4;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *__range4;
  json base;
  ActionMessage *in_stack_fffffffffffff838;
  CommonCore *in_stack_fffffffffffff840;
  BrokerBase *in_stack_fffffffffffff848;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  action_t in_stack_fffffffffffff85c;
  undefined7 in_stack_fffffffffffff860;
  FederateStates in_stack_fffffffffffff867;
  undefined7 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff877;
  GlobalFederateId *in_stack_fffffffffffff878;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__s;
  CommonCore *in_stack_fffffffffffff880;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *in_stack_fffffffffffff888;
  atomic<std::thread::id> *paVar11;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff890;
  TranslatorFederate *pTVar12;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff898;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_fffffffffffff8a0;
  FilterFederate *pFVar13;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_fffffffffffff8a8;
  anon_class_8_1_ba1d3c9a in_stack_fffffffffffff8b0;
  undefined6 in_stack_fffffffffffff8b8;
  BrokerState in_stack_fffffffffffff8be;
  DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff8c0;
  undefined8 in_stack_fffffffffffff910;
  undefined1 hasParent;
  json *in_stack_fffffffffffff918;
  BrokerBase *in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff99b;
  int in_stack_fffffffffffff99c;
  BrokerBase *in_stack_fffffffffffff9a0;
  string_view in_stack_fffffffffffff9a8;
  GlobalFederateId in_stack_fffffffffffff9bc;
  CommonCore *in_stack_fffffffffffffa08;
  FedInfo local_5a8;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_590;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_578;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *local_560;
  undefined4 local_558;
  GlobalFederateId in_stack_fffffffffffffaac;
  CommonCore *in_stack_fffffffffffffab0;
  ActionMessage *in_stack_fffffffffffffad8;
  CommonCore *in_stack_fffffffffffffae0;
  char *in_stack_fffffffffffffae8;
  GlobalFederateId local_48c;
  undefined4 local_488;
  BrokerState local_482;
  undefined1 in_stack_fffffffffffffb97;
  FederateState *in_stack_fffffffffffffb98;
  CommonCore *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  id local_428;
  native_handle_type local_420;
  id local_418;
  id local_410;
  native_handle_type local_408;
  id local_400;
  ActionMessage *local_340;
  CommonCore *local_338;
  __sv_type local_330;
  BaseType local_320;
  GlobalFederateId local_31c;
  BaseType local_318;
  GlobalFederateId local_314;
  __sv_type local_310;
  __sv_type local_300;
  BaseType local_2f0;
  GlobalFederateId local_2ec [9];
  __sv_type local_2c8;
  __sv_type local_278;
  __sv_type local_228;
  BaseType local_204;
  GlobalFederateId local_200;
  BaseType local_1fc;
  FedInfo *local_1c8;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_1c0;
  BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> local_1a8;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *local_190;
  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
  local_188 [5];
  ActionMessage *local_138;
  CommonCore *local_130;
  __sv_type local_128;
  BaseType local_118;
  GlobalFederateId local_114;
  ActionMessage *local_110;
  CommonCore *local_108;
  __sv_type local_100;
  BaseType local_ec;
  GlobalFederateId local_e8;
  BaseType local_e4;
  ActionMessage *local_e0;
  ActionMessage *local_10;
  
  hasParent = (undefined1)((ulong)in_stack_fffffffffffff910 >> 0x38);
  local_10 = in_RSI;
  aVar5 = ActionMessage::action(in_RSI);
  if (aVar5 == cmd_user_disconnect) {
LAB_004a981d:
    bVar3 = isConnected(in_stack_fffffffffffff840);
    if (bVar3) {
      BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x4a9841);
      if (BVar4 < TERMINATING) {
        BrokerBase::setBrokerState
                  (in_stack_fffffffffffff848,(BrokerState)((ulong)in_stack_fffffffffffff840 >> 0x30)
                  );
        sendDisconnect(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac.gid);
      }
    }
    else {
      BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x4a9882);
      if (BVar4 == ERRORED) {
        sendDisconnect(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac.gid);
      }
    }
    ActionMessage::ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
               in_stack_fffffffffffff85c);
    BrokerBase::addActionMessage((BrokerBase *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff840);
  }
  else {
    if (aVar5 != cmd_disconnect) {
      if (aVar5 == cmd_disconnect_check) {
        checkAndProcessDisconnect(in_stack_fffffffffffffa08);
        return;
      }
      if (aVar5 != cmd_disconnect_fed) {
        if (aVar5 == cmd_broadcast_disconnect) {
          pBVar6 = CLI::std::
                   unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                 *)0x4a9931);
          (*pBVar6->_vptr_BaseTimeCoordinator[3])(pBVar6,local_10);
          local_e0 = local_10;
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
          ::apply<helics::CommonCore::processDisconnectCommand(helics::ActionMessage&)::__0>
                    (in_stack_fffffffffffff8a8,in_stack_fffffffffffff8b0);
          checkAndProcessDisconnect(in_stack_fffffffffffffa08);
          return;
        }
        if (aVar5 == cmd_stop) {
          bVar3 = isConnected(in_stack_fffffffffffff840);
          if ((bVar3) &&
             (BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x4aa678), BVar4 < TERMINATING)) {
            BrokerBase::setBrokerState
                      (in_stack_fffffffffffff848,
                       (BrokerState)((ulong)in_stack_fffffffffffff840 >> 0x30));
            sendDisconnect(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac.gid);
          }
          local_400 = std::atomic<std::thread::id>::load(&in_RDI->filterThread,seq_cst);
          local_408 = (native_handle_type)std::this_thread::get_id();
          bVar3 = std::operator==(local_400,(id)local_408);
          if ((bVar3) && (in_RDI->filterFed != (FilterFederate *)0x0)) {
            pFVar13 = in_RDI->filterFed;
            if (pFVar13 != (FilterFederate *)0x0) {
              FilterFederate::~FilterFederate((FilterFederate *)in_stack_fffffffffffff840);
              operator_delete(pFVar13,0x4c0);
            }
            in_RDI->filterFed = (FilterFederate *)0x0;
            paVar11 = &in_RDI->filterThread;
            std::thread::id::id(&local_410);
            std::atomic<std::thread::id>::store(paVar11,local_410,seq_cst);
          }
          local_418 = std::atomic<std::thread::id>::load(&in_RDI->translatorThread,seq_cst);
          local_420 = (native_handle_type)std::this_thread::get_id();
          bVar3 = std::operator==(local_418,(id)local_420);
          if ((bVar3) && (in_RDI->translatorFed != (TranslatorFederate *)0x0)) {
            pTVar12 = in_RDI->translatorFed;
            if (pTVar12 != (TranslatorFederate *)0x0) {
              TranslatorFederate::~TranslatorFederate
                        ((TranslatorFederate *)in_stack_fffffffffffff840);
              operator_delete(pTVar12,0x3d8);
            }
            in_RDI->translatorFed = (TranslatorFederate *)0x0;
            paVar11 = &in_RDI->translatorThread;
            std::thread::id::id(&local_428);
            std::atomic<std::thread::id>::store(paVar11,local_428,seq_cst);
          }
          __s = &in_RDI->activeQueries;
          this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &stack0xfffffffffffffbb7;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (this_00,(char *)__s,
                     (allocator<char> *)
                     CONCAT17(in_stack_fffffffffffff877,in_stack_fffffffffffff870));
          gmlc::concurrency::
          DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::fulfillAllPromises
                    (in_stack_fffffffffffff8c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_fffffffffffff8be,in_stack_fffffffffffff8b8));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff840);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffbb7);
          return;
        }
        if (aVar5 != cmd_global_disconnect) {
          if (aVar5 == cmd_timeout_disconnect) {
            bVar3 = isConnected(in_stack_fffffffffffff840);
            if (bVar3) {
              local_e4 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
              bVar3 = GlobalFederateId::operator!=(&local_10->source_id,(GlobalBrokerId)local_e4);
              if (bVar3) {
                local_ec = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                GlobalFederateId::GlobalFederateId(&local_e8,(GlobalBrokerId)local_ec);
                getIdentifier_abi_cxx11_(in_RDI);
                local_100 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff840);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff850,(char *)in_stack_fffffffffffff848);
                message._M_str = in_stack_fffffffffffffae8;
                message._M_len = (size_t)in_stack_fffffffffffffae0;
                BrokerBase::sendToLogger
                          (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                           in_stack_fffffffffffff99c,in_stack_fffffffffffff9a8,message,
                           (bool)in_stack_fffffffffffff99b);
                in_stack_fffffffffffff838 = local_110;
                in_stack_fffffffffffff840 = local_108;
              }
              else {
                local_118 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                GlobalFederateId::GlobalFederateId(&local_114,(GlobalBrokerId)local_118);
                getIdentifier_abi_cxx11_(in_RDI);
                local_128 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff840);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff850,(char *)in_stack_fffffffffffff848);
                message_00._M_str = in_stack_fffffffffffffae8;
                message_00._M_len = (size_t)in_stack_fffffffffffffae0;
                BrokerBase::sendToLogger
                          (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                           in_stack_fffffffffffff99c,in_stack_fffffffffffff9a8,message_00,
                           (bool)in_stack_fffffffffffff99b);
                in_stack_fffffffffffff838 = local_138;
                in_stack_fffffffffffff840 = local_130;
              }
              bVar3 = std::unique_ptr::operator_cast_to_bool
                                ((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                  *)0x4a9b46);
              if (bVar3) {
                CLI::std::
                unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                              *)0x4a9b67);
                bVar3 = BaseTimeCoordinator::empty((BaseTimeCoordinator *)0x4a9b6f);
                if (!bVar3) {
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                  BrokerBase::addBaseInformation
                            (in_stack_fffffffffffff920,in_stack_fffffffffffff918,(bool)hasParent);
                  BrokerBase::getBrokerState((BrokerBase *)0x4a9bc1);
                  brokerStateName_abi_cxx11_(in_stack_fffffffffffff8be);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::
                  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff850,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff848);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff840);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff850,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff848);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff840);
                  pBVar6 = CLI::std::
                           unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                           ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                         *)0x4a9cb1);
                  pvVar7 = nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           ::operator[]<char_const>
                                     (in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                  (*pBVar6->_vptr_BaseTimeCoordinator[0xc])(pBVar6,pvVar7);
                  CLI::std::
                  initializer_list<nlohmann::json_abi_v3_11_3::detail::json_ref<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  ::initializer_list(local_188);
                  init._M_len._0_4_ = in_stack_fffffffffffff858;
                  init._M_array = (iterator)in_stack_fffffffffffff850;
                  init._M_len._4_4_ = in_stack_fffffffffffff85c;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::array(init);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff850,
                              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffff848);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff840);
                  local_190 = &in_RDI->loopFederates;
                  gmlc::containers::
                  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                  ::begin((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                           *)in_stack_fffffffffffff840);
                  gmlc::containers::
                  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                  ::end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                         *)in_stack_fffffffffffff840);
                  while (bVar3 = gmlc::containers::
                                 BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
                                 ::operator!=(&local_1a8,&local_1c0), bVar3) {
                    local_1c8 = gmlc::containers::
                                BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
                                ::operator*(&local_1a8);
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff850,(char *)in_stack_fffffffffffff848);
                    queryStr._M_str._0_4_ = in_stack_fffffffffffffbb0;
                    queryStr._M_len = in_stack_fffffffffffffba8;
                    queryStr._M_str._4_4_ = in_stack_fffffffffffffbb4;
                    federateQuery_abi_cxx11_
                              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,queryStr,
                               (bool)in_stack_fffffffffffffb97);
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff840,
                                            (char *)in_stack_fffffffffffff838);
                    if (bVar3) {
                      FedInfo::operator->(local_1c8);
                      FVar1 = FederateState::getState((FederateState *)0x4a9e9c);
                      if (FVar1 < TERMINATING) {
                        pFVar10 = FedInfo::operator->(local_1c8);
                        local_1fc = (BaseType)
                                    std::atomic<helics::GlobalFederateId>::load
                                              (&pFVar10->global_id,seq_cst);
                        (local_10->dest_id).gid = local_1fc;
                        local_204 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                        GlobalFederateId::GlobalFederateId(&local_200,(GlobalBrokerId)local_204);
                        (local_10->source_id).gid = local_200.gid;
                        FederateState::addAction
                                  ((FederateState *)in_stack_fffffffffffff840,
                                   in_stack_fffffffffffff838);
                      }
                    }
                    else {
                      local_228 = std::__cxx11::string::operator_cast_to_basic_string_view
                                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)in_stack_fffffffffffff840);
                      jsonString._M_str._0_6_ = in_stack_fffffffffffff8b8;
                      jsonString._M_len = (size_t)in_stack_fffffffffffff8b0.cmd;
                      jsonString._M_str._6_2_ = in_stack_fffffffffffff8be;
                      fileops::loadJsonStr_abi_cxx11_(jsonString);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::operator[]<char_const>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::push_back(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)in_stack_fffffffffffff840);
                    }
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff840);
                    gmlc::containers::
                    BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
                    operator++((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
                                *)in_stack_fffffffffffff840);
                  }
                  if (in_RDI->filterFed != (FilterFederate *)0x0) {
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff850,(char *)in_stack_fffffffffffff848);
                    FilterFederate::query_abi_cxx11_
                              ((FilterFederate *)str_1._M_string_length,(string_view)str_1.field_2);
                    local_278 = std::__cxx11::string::operator_cast_to_basic_string_view
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffff840);
                    jsonString_00._M_str._0_6_ = in_stack_fffffffffffff8b8;
                    jsonString_00._M_len = (size_t)in_stack_fffffffffffff8b0.cmd;
                    jsonString_00._M_str._6_2_ = in_stack_fffffffffffff8be;
                    fileops::loadJsonStr_abi_cxx11_(jsonString_00);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::push_back(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffff840);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff840);
                  }
                  if (in_RDI->translatorFed != (TranslatorFederate *)0x0) {
                    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                              (in_stack_fffffffffffff850,(char *)in_stack_fffffffffffff848);
                    TranslatorFederate::query_abi_cxx11_
                              ((TranslatorFederate *)str_1._M_string_length,
                               (string_view)str_1.field_2);
                    local_2c8 = std::__cxx11::string::operator_cast_to_basic_string_view
                                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)in_stack_fffffffffffff840);
                    jsonString_01._M_str._0_6_ = in_stack_fffffffffffff8b8;
                    jsonString_01._M_len = (size_t)in_stack_fffffffffffff8b0.cmd;
                    jsonString_01._M_str._6_2_ = in_stack_fffffffffffff8be;
                    fileops::loadJsonStr_abi_cxx11_(jsonString_01);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>(in_stack_fffffffffffff890,in_stack_fffffffffffff888);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::push_back(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffff840);
                    std::__cxx11::string::~string
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff840);
                  }
                  fileops::generateJsonString
                            ((json *)in_stack_fffffffffffff848,
                             SUB81((ulong)in_stack_fffffffffffff840 >> 0x38,0));
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                             CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),
                             (char *)in_stack_fffffffffffff850);
                  local_2f0 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                  GlobalFederateId::GlobalFederateId(local_2ec,(GlobalBrokerId)local_2f0);
                  local_300 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff840);
                  local_310 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)in_stack_fffffffffffff840);
                  message_01._M_str = in_stack_fffffffffffffae8;
                  message_01._M_len = (size_t)in_stack_fffffffffffffae0;
                  in_stack_fffffffffffff838 = (ActionMessage *)local_310._M_len;
                  in_stack_fffffffffffff840 = (CommonCore *)local_310._M_str;
                  BrokerBase::sendToLogger
                            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                             in_stack_fffffffffffff99c,in_stack_fffffffffffff9a8,message_01,
                             (bool)in_stack_fffffffffffff99b);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffff840);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffff840);
                }
              }
              BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x4aa484);
              if (BVar4 < TERMINATING) {
                BrokerBase::setBrokerState
                          (in_stack_fffffffffffff848,
                           (BrokerState)((ulong)in_stack_fffffffffffff840 >> 0x30));
                local_318 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                GlobalFederateId::GlobalFederateId(&local_314,(GlobalBrokerId)local_318);
                (local_10->source_id).gid = local_314.gid;
                broadcastToFederates(in_stack_fffffffffffff840,in_stack_fffffffffffff838);
                sendDisconnect(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac.gid);
              }
            }
            else {
              BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x4aa515);
              if (BVar4 == ERRORED) {
                local_320 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
                GlobalFederateId::GlobalFederateId(&local_31c,(GlobalBrokerId)local_320);
                getIdentifier_abi_cxx11_(in_RDI);
                local_330 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)in_stack_fffffffffffff840);
                CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (in_stack_fffffffffffff850,(char *)in_stack_fffffffffffff848);
                message_02._M_str = in_stack_fffffffffffffae8;
                message_02._M_len = (size_t)in_stack_fffffffffffffae0;
                BrokerBase::sendToLogger
                          (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                           in_stack_fffffffffffff99c,in_stack_fffffffffffff9a8,message_02,
                           (bool)in_stack_fffffffffffff99b);
                sendDisconnect(in_stack_fffffffffffffab0,in_stack_fffffffffffffaac.gid);
                in_stack_fffffffffffff838 = local_340;
                in_stack_fffffffffffff840 = local_338;
              }
            }
            ActionMessage::ActionMessage
                      ((ActionMessage *)
                       CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                       in_stack_fffffffffffff85c);
            BrokerBase::addActionMessage
                      ((BrokerBase *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
            ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff840);
            return;
          }
          if (aVar5 != cmd_disconnect_core_ack) {
            return;
          }
          bVar3 = GlobalFederateId::operator==
                            (&local_10->dest_id,
                             (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
          if (!bVar3) {
            return;
          }
          bVar3 = GlobalFederateId::operator==
                            (&local_10->source_id,
                             (GlobalBrokerId)(in_RDI->super_BrokerBase).higher_broker_id.gid);
          if (!bVar3) {
            return;
          }
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                     in_stack_fffffffffffff85c);
          local_558 = 0;
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffaac,(GlobalBrokerId)0x0);
          local_560 = &in_RDI->loopFederates;
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::begin((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                   *)in_stack_fffffffffffff840);
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                 *)in_stack_fffffffffffff840);
          pFVar8 = (FedInfo *)((ulong)(uint)in_stack_fffffffffffff85c << 0x20);
          while( true ) {
            bVar3 = gmlc::containers::
                    BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
                    operator!=(&local_578,&local_590);
            if (!bVar3) break;
            pFVar9 = gmlc::containers::
                     BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::
                     operator*(&local_578);
            local_5a8.fed = pFVar9->fed;
            local_5a8.state = pFVar9->state;
            local_5a8._9_7_ = *(undefined7 *)&pFVar9->field_0x9;
            FedInfo::operator->(&local_5a8);
            in_stack_fffffffffffff867 = FederateState::getState((FederateState *)0x4aac7e);
            if (in_stack_fffffffffffff867 != FINISHED) {
              pFVar8 = &local_5a8;
              pFVar10 = FedInfo::operator->(pFVar8);
              std::atomic<helics::GlobalFederateId>::load(&pFVar10->global_id,seq_cst);
              FedInfo::operator->(pFVar8);
              FederateState::addAction
                        ((FederateState *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
            }
            gmlc::containers::
            BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>::operator++
                      ((BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*> *)
                       in_stack_fffffffffffff840);
          }
          ActionMessage::ActionMessage
                    ((ActionMessage *)CONCAT17(in_stack_fffffffffffff867,in_stack_fffffffffffff860),
                     (action_t)((ulong)pFVar8 >> 0x20));
          BrokerBase::addActionMessage
                    ((BrokerBase *)in_stack_fffffffffffff840,in_stack_fffffffffffff838);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff840);
          ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffff840);
          return;
        }
        goto LAB_004a981d;
      }
    }
    bVar3 = GlobalFederateId::operator==(&local_10->dest_id,(GlobalBrokerId)0x0);
    if (bVar3) {
      BVar4 = BrokerBase::getBrokerState((BrokerBase *)0x4aa94d);
      if (BVar4 < TERMINATING) {
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::find((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
                *)in_stack_fffffffffffff880,in_stack_fffffffffffff878);
        gmlc::containers::
        DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
        ::end((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
               *)in_stack_fffffffffffff840);
        bVar3 = gmlc::containers::BlockIterator<helics::FedInfo,32,helics::FedInfo**>::operator==
                          ((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)
                           in_stack_fffffffffffff840,
                           (BlockIterator<const_helics::FedInfo,_32,_const_helics::FedInfo_*const_*>
                            *)in_stack_fffffffffffff838);
        if (!bVar3) {
          pFVar8 = gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::
                   operator->((BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> *)
                              &stack0xfffffffffffffb98);
          pFVar8->state = DISCONNECTED;
          local_482 = BrokerBase::getBrokerState((BrokerBase *)0x4aa9dd);
          bVar3 = checkAndProcessDisconnect(in_stack_fffffffffffffa08);
          if ((!bVar3) || (local_482 < OPERATING)) {
            ActionMessage::setAction(local_10,cmd_disconnect_fed);
            local_488 = 0;
            (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_10);
            OVar2 = minFederateState(in_stack_fffffffffffff880);
            if (((OVar2 != DISCONNECTED) ||
                ((in_RDI->filterFed != (FilterFederate *)0x0 ||
                 (in_RDI->translatorFed != (TranslatorFederate *)0x0)))) &&
               (((in_RDI->super_BrokerBase).globalDisconnect & 1U) == 0)) {
              ActionMessage::setAction(local_10,cmd_disconnect_fed_ack);
              (local_10->dest_id).gid = (local_10->source_id).gid;
              GlobalFederateId::GlobalFederateId(&local_48c,(GlobalBrokerId)0x0);
              (local_10->source_id).gid = local_48c.gid;
              routeMessage(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
            }
          }
        }
      }
    }
    else {
      routeMessage(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    }
  }
  return;
}

Assistant:

void CommonCore::processDisconnectCommand(ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_USER_DISCONNECT:
        case CMD_GLOBAL_DISCONNECT:
            if (isConnected()) {
                if (getBrokerState() <
                    BrokerState::TERMINATING) {  // only send a disconnect message
                                                 // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    sendDisconnect();
                }
            } else if (getBrokerState() ==
                       BrokerState::ERRORED) {  // we are disconnecting in an error state
                sendDisconnect();
            }
            addActionMessage(CMD_STOP);
            // we can't just fall through since this may have generated other messages that need to
            // be forwarded or processed
            break;
        case CMD_BROADCAST_DISCONNECT:
            timeCoord->processTimeMessage(cmd);
            loopFederates.apply([&cmd](auto& fed) { fed->addAction(cmd); });
            checkAndProcessDisconnect();
            break;
        case CMD_TIMEOUT_DISCONNECT:
            if (isConnected()) {
                if (cmd.source_id != global_broker_id_local) {
                    LOG_ERROR(global_broker_id_local,
                              getIdentifier(),
                              "received timeout disconnect");
                } else {
                    LOG_ERROR(global_broker_id_local, getIdentifier(), "timeout disconnect");
                }
                if (timeCoord && !timeCoord->empty()) {
                    nlohmann::json base;
                    addBaseInformation(base, true);
                    base["state"] = brokerStateName(getBrokerState());
                    base["time"] = nlohmann::json();
                    timeCoord->generateDebuggingTimeInfo(base["time"]);
                    base["federates"] = nlohmann::json::array();
                    for (const auto& fed : loopFederates) {
                        const std::string ret =
                            federateQuery(fed.fed, "global_time_debugging", false);
                        if (ret == "#wait") {
                            if (fed->getState() <= FederateStates::EXECUTING) {
                                cmd.dest_id = fed->global_id.load();
                                cmd.source_id = global_broker_id_local;
                                fed.fed->addAction(cmd);
                            }
                        } else {
                            auto element = fileops::loadJsonStr(ret);
                            base["federates"].push_back(element);
                        }
                    }
                    if (filterFed != nullptr) {
                        auto str = filterFed->query("global_time_debugging");
                        auto element = fileops::loadJsonStr(str);
                        base["federates"].push_back(element);
                    }
                    if (translatorFed != nullptr) {
                        auto str = translatorFed->query("global_time_debugging");
                        auto element = fileops::loadJsonStr(str);
                        base["federates"].push_back(element);
                    }
                    auto debugString = fileops::generateJsonString(base);
                    debugString.insert(0, "TIME DEBUGGING::");
                    LOG_WARNING(global_broker_id_local, identifier, debugString);
                }

                if (getBrokerState() < BrokerState::TERMINATING) {
                    // only send a disconnect message
                    // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    cmd.source_id = global_broker_id_local;
                    broadcastToFederates(cmd);
                    sendDisconnect();
                }
            } else if (getBrokerState() == BrokerState::ERRORED) {
                // we are disconnecting in an error state
                LOG_ERROR(global_broker_id_local,
                          getIdentifier(),
                          "received timeout disconnect in error state");
                sendDisconnect();
            }
            addActionMessage(CMD_STOP);
            break;
        case CMD_STOP:

            if (isConnected()) {
                if (getBrokerState() <
                    BrokerState::TERMINATING) {  // only send a disconnect message
                                                 // if we haven't done so already
                    setBrokerState(BrokerState::TERMINATING);
                    sendDisconnect();
                }
            }
            if (filterThread.load() == std::this_thread::get_id()) {
                if (filterFed != nullptr) {
                    delete filterFed;
                    filterFed = nullptr;
                    filterThread.store(std::thread::id{});
                }
            }
            if (translatorThread.load() == std::this_thread::get_id()) {
                if (translatorFed != nullptr) {
                    delete translatorFed;
                    translatorFed = nullptr;
                    translatorThread.store(std::thread::id{});
                }
            }
            activeQueries.fulfillAllPromises("#disconnected");
            break;
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_FED:
            if (cmd.dest_id == parent_broker_id) {
                if (getBrokerState() < BrokerState::TERMINATING) {
                    auto fed = loopFederates.find(cmd.source_id);
                    if (fed == loopFederates.end()) {
                        return;
                    }
                    fed->state = OperatingState::DISCONNECTED;
                    auto cstate = getBrokerState();
                    if ((!checkAndProcessDisconnect()) || (cstate < BrokerState::OPERATING)) {
                        cmd.setAction(CMD_DISCONNECT_FED);
                        transmit(parent_route_id, cmd);
                        if ((minFederateState() != OperatingState::DISCONNECTED ||
                             filterFed != nullptr || translatorFed != nullptr) &&
                            !globalDisconnect) {
                            cmd.setAction(CMD_DISCONNECT_FED_ACK);
                            cmd.dest_id = cmd.source_id;
                            cmd.source_id = parent_broker_id;
                            routeMessage(cmd);
                        }
                    }
                }
            } else {
                routeMessage(cmd);
            }

            break;
        case CMD_DISCONNECT_CHECK:
            checkAndProcessDisconnect();
            break;
        case CMD_DISCONNECT_CORE_ACK:
            if ((cmd.dest_id == global_broker_id_local) && (cmd.source_id == higher_broker_id)) {
                ActionMessage bye(CMD_DISCONNECT_FED_ACK);
                bye.source_id = parent_broker_id;
                for (auto fed : loopFederates) {
                    if (fed->getState() != FederateStates::FINISHED) {
                        bye.dest_id = fed->global_id.load();
                        fed->addAction(bye);
                    }
                }
                addActionMessage(CMD_STOP);
            }
            break;
        default:
            break;
    }
}